

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O2

int __thiscall
sqvector<SQObjectPtr>::copy(sqvector<SQObjectPtr> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  ulong uVar1;
  SQUnsignedInteger i;
  ulong uVar2;
  long lVar3;
  SQObjectPtr local_30;
  
  if (this->_size != 0) {
    local_30.super_SQObject._type = OT_NULL;
    local_30.super_SQObject._unVal.pTable = (SQTable *)0x0;
    resize(this,0,&local_30);
    SQObjectPtr::~SQObjectPtr(&local_30);
  }
  if (this->_allocated < *(ulong *)(dst + 8)) {
    _realloc(this,*(ulong *)(dst + 8));
  }
  lVar3 = 0;
  for (uVar2 = 0; uVar1 = *(ulong *)(dst + 8), uVar2 < uVar1; uVar2 = uVar2 + 1) {
    SQObjectPtr::SQObjectPtr
              ((SQObjectPtr *)((long)&(this->_vals->super_SQObject)._type + lVar3),
               (SQObjectPtr *)(*(long *)dst + lVar3));
    lVar3 = lVar3 + 0x10;
  }
  this->_size = uVar1;
  return (int)uVar1;
}

Assistant:

void copy(const sqvector<T>& v)
    {
        if(_size) {
            resize(0); //destroys all previous stuff
        }
        //resize(v._size);
        if(v._size > _allocated) {
            _realloc(v._size);
        }
        for(SQUnsignedInteger i = 0; i < v._size; i++) {
            new ((void *)&_vals[i]) T(v._vals[i]);
        }
        _size = v._size;
    }